

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogicOperatorType.cpp
# Opt level: O0

LogicOperatorType IRT::Reverse(LogicOperatorType type)

{
  code *pcVar1;
  LogicOperatorType local_9;
  LogicOperatorType type_local;
  
  switch(type) {
  case LT:
    local_9 = GT;
    break;
  case LE:
    local_9 = GE;
    break;
  case GT:
    local_9 = LT;
    break;
  case GE:
    local_9 = LE;
    break;
  case EQ:
    local_9 = EQ;
    break;
  case NE:
    local_9 = NE;
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return local_9;
}

Assistant:

IRT::LogicOperatorType IRT::Reverse(LogicOperatorType type) {
  switch (type) {
    case LogicOperatorType::EQ:
      return LogicOperatorType::EQ;
    case LogicOperatorType::NE:
      return LogicOperatorType::NE;
    case LogicOperatorType::LT:
      return LogicOperatorType::GT;
    case LogicOperatorType::GT:
      return LogicOperatorType::LT;
    case LogicOperatorType::LE:
      return LogicOperatorType::GE;
    case LogicOperatorType::GE:
      return LogicOperatorType::LE;
  }
}